

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

int Fra_ClassesRefine(Fra_Cla_t *p)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  long lVar8;
  
  pVVar6 = p->vClassesTemp;
  pVVar6->nSize = 0;
  pVVar4 = p->vClasses;
  if (pVVar4->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    iVar7 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[lVar8];
      if (*plVar2 == 0) {
        __assert_fail("pClass[0] != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                      ,0x1f8,"int Fra_ClassesRefine(Fra_Cla_t *)");
      }
      pVVar4 = p->vClassesTemp;
      uVar1 = pVVar4->nSize;
      if (uVar1 == pVVar4->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      iVar3 = pVVar4->nSize;
      pVVar4->nSize = iVar3 + 1;
      ppvVar5[iVar3] = plVar2;
      iVar3 = Fra_RefineClassLastIter(p,p->vClassesTemp);
      iVar7 = iVar7 + iVar3;
      lVar8 = lVar8 + 1;
      pVVar4 = p->vClasses;
    } while (lVar8 < pVVar4->nSize);
    pVVar6 = p->vClassesTemp;
  }
  p->vClassesTemp = pVVar4;
  p->vClasses = pVVar6;
  return iVar7;
}

Assistant:

int Fra_ClassesRefine( Fra_Cla_t * p )
{
    Vec_Ptr_t * vTemp;
    Aig_Obj_t ** pClass;
    int i, nRefis;
    // refine the classes
    nRefis = 0;
    Vec_PtrClear( p->vClassesTemp );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // add the class to the new array
        assert( pClass[0] != NULL );
        Vec_PtrPush( p->vClassesTemp, pClass );
        // refine the class iteratively
        nRefis += Fra_RefineClassLastIter( p, p->vClassesTemp );
    }
    // exchange the class representation
    vTemp = p->vClassesTemp;
    p->vClassesTemp = p->vClasses;
    p->vClasses = vTemp;
    return nRefis;
}